

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

void readBup<BupHeaderSwitch>(istream *stream,BupHeader *header)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  ulong uVar4;
  undefined1 *in_RSI;
  BupExpressionChunkSwitch *in_RDI;
  BupExpressionChunkSwitch c_1;
  value_type *expChunk;
  size_t i;
  BupChunkSwitch c;
  BupChunk *chunk;
  iterator __end1;
  iterator __begin1;
  vector<BupChunk,_std::allocator<BupChunk>_> *__range1;
  BupHeaderSwitch h;
  BupChunkSwitch *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  BupHeaderSwitch *in_stack_fffffffffffffeb8;
  char *src;
  BupHeader *in_stack_fffffffffffffec0;
  BupExpressionChunkSwitch *in;
  BupExpressionChunk *in_stack_fffffffffffffed0;
  string local_120 [8];
  unsigned_long in_stack_fffffffffffffee8;
  string local_100 [32];
  string local_e0 [36];
  char local_bc [76];
  reference local_70;
  ulong local_68;
  BupChunkSwitch local_60;
  reference local_58;
  BupChunk *local_50;
  __normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_> local_48;
  undefined1 *local_40;
  undefined1 *local_10;
  BupExpressionChunkSwitch *local_8;
  
  *in_RSI = 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  readRaw<BupHeaderSwitch>((istream *)in_stack_fffffffffffffeb0);
  copyTo<BupHeaderSwitch>(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  in = local_8;
  boost::endian::endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
  ::value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> *)
          0x1183ea);
  std::istream::ignore((long)in);
  local_40 = local_10 + 0x10;
  local_48._M_current =
       (BupChunk *)
       std::vector<BupChunk,_std::allocator<BupChunk>_>::begin
                 ((vector<BupChunk,_std::allocator<BupChunk>_> *)in_stack_fffffffffffffea8);
  local_50 = (BupChunk *)
             std::vector<BupChunk,_std::allocator<BupChunk>_>::end
                       ((vector<BupChunk,_std::allocator<BupChunk>_> *)in_stack_fffffffffffffea8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>
                             *)in_stack_fffffffffffffeb0,
                            (__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>
                             *)in_stack_fffffffffffffea8), bVar1) {
    local_58 = __gnu_cxx::
               __normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>::
               operator*(&local_48);
    local_60 = readRaw<BupChunkSwitch>((istream *)in_stack_fffffffffffffea8);
    copyTo<BupChunkSwitch>((BupChunk *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    __gnu_cxx::__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>::
    operator++(&local_48);
  }
  std::istream::ignore((long)local_8);
  local_68 = 0;
  while (uVar4 = local_68,
        sVar2 = std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::size
                          ((vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_> *)
                           (local_10 + 0x28)), uVar4 < sVar2) {
    local_70 = std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::operator[]
                         ((vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_> *)
                          (local_10 + 0x28),local_68);
    readRaw<BupExpressionChunkSwitch>((istream *)in_stack_fffffffffffffeb0);
    copyTo<BupExpressionChunkSwitch>(in_stack_fffffffffffffed0,in);
    src = local_bc;
    strnlen(local_bc,0x14);
    toUTF8_abi_cxx11_(src,(size_t)in_stack_fffffffffffffeb0);
    std::__cxx11::string::operator=((string *)local_70,local_e0);
    std::__cxx11::string::~string(local_e0);
    bVar1 = BupExpressionChunkSwitch::unkBytesValid((BupExpressionChunkSwitch *)0x118594);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Expression ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_68);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,(string *)local_70);
      poVar3 = std::operator<<(poVar3,", had unexpected nonzero values in its expression data...");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      in_stack_fffffffffffffeb0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
      std::__cxx11::to_string(in_stack_fffffffffffffee8);
      std::operator+(src,in_stack_fffffffffffffeb0);
      std::__cxx11::string::operator=((string *)local_70,local_100);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_120);
    }
    local_68 = local_68 + 1;
  }
  return;
}

Assistant:

void readBup(std::istream& stream, BupHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	copyTo(header, h);

	// Skip bytes for unknown reason
	stream.ignore(h.tbl1.value() * h.skipAmount);

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		copyTo(chunk, c);
	}

	stream.ignore(h.skipAmount2);

	for (size_t i = 0; i < header.expChunks.size(); i++) {
		auto& expChunk = header.expChunks[i];

		auto c = readRaw<typename Header::ExpressionChunk>(stream);
		copyTo(expChunk, c);
		expChunk.name = toUTF8(c.name, strnlen(c.name, sizeof(c.name)));

		if (!c.unkBytesValid()) {
			std::cerr << "Expression " << i << ", " << expChunk.name << ", had unexpected nonzero values in its expression data..." << std::endl;
		}

		if (expChunk.name.empty()) {
			expChunk.name = "expression" + std::to_string(i);
		}
	}
}